

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

KeyData * cfd::capi::ParsePubkey
                    (KeyData *__return_storage_ptr__,int kind,char *pubkey,NetType net_type)

{
  NetType NVar1;
  CfdException *pCVar2;
  allocator local_251;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_250;
  string local_238;
  string pubkey_str;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  ExtPubkey local_1e0;
  KeyData local_170;
  
  std::__cxx11::string::string((string *)&pubkey_str,pubkey,(allocator *)&local_170);
  if ((kind != 4) != (pubkey_str._M_string_length == 0x42)) {
    local_170.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
    local_170.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xa5;
    local_170.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "ParsePubkey";
    core::logger::warn<>((CfdSourceLocation *)&local_170,"unmatch pubkey type.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_170,"Failed to parameter. unmatch pubkey type.",
               (allocator *)&local_1e0);
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_170);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (pubkey_str._M_string_length == 0x42) {
    core::KeyData::KeyData(__return_storage_ptr__,&pubkey_str,-1,false);
  }
  else {
    core::KeyData::KeyData(__return_storage_ptr__);
    if (pubkey_str._M_string_length == 0x9c) {
      core::ByteData::ByteData((ByteData *)&local_250,&pubkey_str);
      core::ExtPubkey::ExtPubkey(&local_1e0,(ByteData *)&local_250);
      std::__cxx11::string::string((string *)&local_238,"",&local_251);
      core::ByteData::ByteData((ByteData *)&local_1f8);
      core::KeyData::KeyData(&local_170,&local_1e0,&local_238,(ByteData *)&local_1f8);
      core::KeyData::operator=(__return_storage_ptr__,&local_170);
      core::KeyData::~KeyData(&local_170);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f8);
      std::__cxx11::string::~string((string *)&local_238);
      core::ExtPubkey::~ExtPubkey(&local_1e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_250);
    }
    else {
      core::ExtPubkey::ExtPubkey(&local_1e0,&pubkey_str);
      std::__cxx11::string::string((string *)&local_238,"",(allocator *)&local_1f8);
      core::ByteData::ByteData((ByteData *)&local_250);
      core::KeyData::KeyData(&local_170,&local_1e0,&local_238,(ByteData *)&local_250);
      core::KeyData::operator=(__return_storage_ptr__,&local_170);
      core::KeyData::~KeyData(&local_170);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_250);
      std::__cxx11::string::~string((string *)&local_238);
      core::ExtPubkey::~ExtPubkey(&local_1e0);
    }
    core::KeyData::GetExtPubkey((ExtPubkey *)&local_170,__return_storage_ptr__);
    NVar1 = core::ExtPubkey::GetNetworkType((ExtPubkey *)&local_170);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)&local_170);
    if ((net_type != kMainnet) == (NVar1 == kMainnet)) {
      local_170.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcapi_psbt.cpp";
      local_170.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0xb9;
      local_170.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "ParsePubkey";
      core::logger::warn<>((CfdSourceLocation *)&local_170,"unmatch xpubkey network type.");
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_170,"Failed to parameter. unmatch xpubkey network type.",
                 (allocator *)&local_1e0);
      core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_170);
      __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  std::__cxx11::string::~string((string *)&pubkey_str);
  return __return_storage_ptr__;
}

Assistant:

static KeyData ParsePubkey(int kind, const char* pubkey, NetType net_type) {
  constexpr size_t kCompressPubkeyHexSize = Pubkey::kCompressedPubkeySize * 2;
  std::string pubkey_str(pubkey);

  bool has_extpubkey = false;
  switch (kind) {
    case kCfdPsbtRecordGloalXpub:
      has_extpubkey = true;
      break;
    case kCfdPsbtRecordInputBip32:
    case kCfdPsbtRecordInputSignature:
    case kCfdPsbtRecordOutputBip32:
    default:
      break;
  }

  bool is_pubkey = false;
  if (pubkey_str.length() == kCompressPubkeyHexSize) {
    is_pubkey = true;
  }
  if (is_pubkey == has_extpubkey) {
    warn(CFD_LOG_SOURCE, "unmatch pubkey type.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. unmatch pubkey type.");
  }

  if (is_pubkey) {
    return KeyData(pubkey_str);
  }
  KeyData data;
  if (pubkey_str.length() == kCfdExtPubkeyHexSize) {
    data = KeyData(ExtPubkey(ByteData(pubkey_str)), "", ByteData());
  } else {
    data = KeyData(ExtPubkey(pubkey_str), "", ByteData());
  }
  bool has_mainnet =
      (data.GetExtPubkey().GetNetworkType() == NetType::kMainnet);

  if (((net_type == NetType::kMainnet) && (!has_mainnet)) ||
      ((net_type != NetType::kMainnet) && (has_mainnet))) {
    warn(CFD_LOG_SOURCE, "unmatch xpubkey network type.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. unmatch xpubkey network type.");
  }
  return data;
}